

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O3

void __thiscall
CTestResource_TestPlanar2D_YV12_Test::TestBody(CTestResource_TestPlanar2D_YV12_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *expected;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  ulong uStack_a0;
  uint local_98 [18];
  internal local_50 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  local_a8 = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_98[0x10] = 0;
  local_98[0x11] = 0;
  local_d0 = 0x17400000002;
  local_98[0xc] = 0;
  local_98[0xd] = 1;
  local_c8 = 0x400000000;
  uStack_a0 = 0x100;
  local_98[0] = 0x100;
  local_98[1] = 1;
  local_c0 = 0x80000;
  ResourceInfo = (GMM_RESOURCE_INFO *)
                 (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                           (CommonULT::pGmmULTClientContext,&local_d0);
  uVar2 = uStack_a0;
  uVar1 = (uint)uStack_a0;
  uVar4 = local_98[0] * (uint)uStack_a0 >> 2;
  uVar7 = local_98[0] * (uint)uStack_a0 + uVar4;
  uVar4 = uVar4 + uVar7;
  uVar5 = uVar4 % (uint)uStack_a0;
  CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,(uint)uStack_a0);
  CTestResource::VerifyResourceSize<true>
            (&this->super_CTestResource,ResourceInfo,(ulong)((uVar4 + 0xfff) - uVar5 & 0xfffff000));
  expected = &gtest_ar.message_;
  gtest_ar.message_.ptr_._0_4_ = 0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,1);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",(int *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd2f,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = 0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,1);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_50,"0","ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",(int *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd30,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = 0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",(int *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd33,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,"gmmParams.BaseHeight","ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",local_98,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd34,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = (uint)((ulong)uVar7 % (uVar2 & 0xffffffff));
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,"UByteOffset % Pitch","ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",
             (uint *)&gtest_ar.message_,(unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd39,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = uVar7 / uVar1;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,"UByteOffset / Pitch","ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",
             (uint *)&gtest_ar.message_,(unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd3a,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,ResourceInfo);
  return;
}

Assistant:

TEST_F(CTestResource, TestPlanar2D_YV12)
{
    /* Test planar surface V surface follows U surface linearly */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // VVVVVV..  <-- V and U planes follow the Y plane, as linear
    // ..UUUUUU      arrays--without respect to pitch.
    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.BaseWidth64          = 0x100;
    gmmParams.BaseHeight           = 0x100;
    gmmParams.Depth                = 0x1;
    gmmParams.Flags.Info.Linear    = 1; // Linear only since UV plane doesn't have a pitch
    gmmParams.Format               = GMM_FORMAT_YV12;

    GMM_RESOURCE_INFO *ResourceInfo;
    ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

    uint32_t Pitch   = gmmParams.BaseWidth64;
    uint32_t SizeOfY = Pitch * gmmParams.BaseHeight;
    uint32_t Height  = (SizeOfY /*Y*/ + SizeOfY / 4 /*V*/ + SizeOfY / 4 /*U*/) / Pitch;
    uint32_t Size    = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

    VerifyResourcePitch<true>(ResourceInfo, Pitch);
    VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
    VerifyResourceSize<true>(ResourceInfo, Size);
    VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

    // Y plane should be at 0,0
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
    EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

    // V plane follows Y
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));
    EXPECT_EQ(gmmParams.BaseHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

    // U plane should be at end of V plane
    uint32_t UByteOffset = SizeOfY /* Y */ +
                           SizeOfY / 4; /* Size of V = 1/4 of Y */
    EXPECT_EQ(UByteOffset % Pitch, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
    EXPECT_EQ(UByteOffset / Pitch, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));

    pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
}